

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_ImplicationExprPrecedence_Test::TestBody
          (ExprWriterTest_ImplicationExprPrecedence_Test *this)

{
  ExprFactory *this_00;
  LogicalExpr LVar1;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> BVar2;
  LogicalExpr condition;
  ExprBase else_expr;
  NumericConstant then_expr;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65> BVar3;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
  BVar4;
  ExprBase EVar5;
  char *pcVar6;
  AssertHelper local_68;
  AssertionResult gtest_ar;
  string local_50;
  
  this_00 = &(this->super_ExprWriterTest).super_ExprFactory;
  else_expr.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,0.0);
  then_expr = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,1.0);
  LVar1.super_ExprBase.impl_ =
       (ExprBase)
       (this->super_ExprWriterTest).l0.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
       super_ExprBase.impl_;
  BVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,LVar1,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     (this->super_ExprWriterTest).l1.
                     super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_,
                     LVar1);
  BVar2.super_ExprBase.impl_ =
       (ExprBase)
       (this->super_ExprWriterTest).l0.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
       super_ExprBase.impl_;
  BVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,
                     (LogicalExpr)
                     BVar3.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.
                     impl_,BVar2,BVar2);
  EVar5.impl_ = else_expr.impl_;
  local_68.data_ =
       (AssertHelperData *)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,
                  (LogicalExpr)
                  BVar3.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_
                  ,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                   then_expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                   impl_,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)else_expr.impl_);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_50,(fmt *)0x14e4d3,(CStringRef)&local_68,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)EVar5.impl_);
  testing::internal::CmpHelperEQ<char[24],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"if 0 ==> 1 ==> 0 then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeImplication(MakeImplication(l0, l1, l0), l0, l0), n1, n0)))"
             ,(char (*) [24])"if 0 ==> 1 ==> 0 then 1",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2e3,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  LVar1.super_ExprBase.impl_ =
       (ExprBase)
       (this->super_ExprWriterTest).l0.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
       super_ExprBase.impl_;
  BVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,LVar1,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     (this->super_ExprWriterTest).l1.
                     super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_,
                     LVar1);
  BVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,
                     (LogicalExpr)
                     BVar3.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.
                     impl_,(BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                           (this->super_ExprWriterTest).l0.
                           super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.
                           impl_,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     (this->super_ExprWriterTest).l1.
                     super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_);
  EVar5.impl_ = else_expr.impl_;
  local_68.data_ =
       (AssertHelperData *)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,
                  (LogicalExpr)
                  BVar3.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_
                  ,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                   then_expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                   impl_,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)else_expr.impl_);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_50,(fmt *)0x14e4d3,(CStringRef)&local_68,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)EVar5.impl_);
  testing::internal::CmpHelperEQ<char[31],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"if 0 ==> 1 ==> 0 else 1 then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeImplication(MakeImplication(l0, l1, l0), l0, l1), n1, n0)))"
             ,(char (*) [31])"if 0 ==> 1 ==> 0 else 1 then 1",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2e5,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  LVar1.super_ExprBase.impl_ =
       (ExprBase)
       (this->super_ExprWriterTest).l0.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
       super_ExprBase.impl_;
  BVar2.super_ExprBase.impl_ =
       (ExprBase)
       (this->super_ExprWriterTest).l1.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
       super_ExprBase.impl_;
  BVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,LVar1,BVar2,LVar1);
  BVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,LVar1,BVar2,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     BVar3.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.
                     impl_);
  EVar5.impl_ = else_expr.impl_;
  local_68.data_ =
       (AssertHelperData *)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,
                  (LogicalExpr)
                  BVar3.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_
                  ,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                   then_expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                   impl_,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)else_expr.impl_);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_50,(fmt *)0x14e4d3,(CStringRef)&local_68,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)EVar5.impl_);
  testing::internal::CmpHelperEQ<char[31],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"if 0 ==> 1 else 0 ==> 1 then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeImplication(l0, l1, MakeImplication(l0, l1, l0)), n1, n0)))"
             ,(char (*) [31])"if 0 ==> 1 else 0 ==> 1 then 1",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2e7,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  LVar1.super_ExprBase.impl_ =
       (ExprBase)
       (this->super_ExprWriterTest).l0.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
       super_ExprBase.impl_;
  BVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,
                     (LogicalExpr)
                     (this->super_ExprWriterTest).l1.
                     super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)LVar1.super_ExprBase.impl_,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)LVar1.super_ExprBase.impl_);
  BVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,LVar1,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     BVar3.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.
                     impl_,(BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                           (this->super_ExprWriterTest).l1.
                           super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.
                           impl_);
  EVar5.impl_ = else_expr.impl_;
  local_68.data_ =
       (AssertHelperData *)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,
                  (LogicalExpr)
                  BVar3.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_
                  ,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                   then_expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                   impl_,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)else_expr.impl_);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_50,(fmt *)0x14e4d3,(CStringRef)&local_68,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)EVar5.impl_);
  testing::internal::CmpHelperEQ<char[33],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"if 0 ==> (1 ==> 0) else 1 then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeImplication(l0, MakeImplication(l1, l0, l0), l1), n1, n0)))"
             ,(char (*) [33])"if 0 ==> (1 ==> 0) else 1 then 1",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2e9,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  LVar1.super_ExprBase.impl_ =
       (ExprBase)
       (this->super_ExprWriterTest).l0.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
       super_ExprBase.impl_;
  condition.super_ExprBase.impl_ =
       (ExprBase)
       (this->super_ExprWriterTest).l1.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
       super_ExprBase.impl_;
  BVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,condition,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)LVar1.super_ExprBase.impl_,
                     condition);
  BVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,LVar1,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     BVar3.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.
                     impl_,(BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                           (this->super_ExprWriterTest).l0.
                           super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.
                           impl_);
  EVar5.impl_ = else_expr.impl_;
  local_68.data_ =
       (AssertHelperData *)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,
                  (LogicalExpr)
                  BVar3.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_
                  ,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                   then_expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                   impl_,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)else_expr.impl_);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_50,(fmt *)0x14e4d3,(CStringRef)&local_68,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)EVar5.impl_);
  testing::internal::CmpHelperEQ<char[33],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"if 0 ==> (1 ==> 0 else 1) then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeImplication(l0, MakeImplication(l1, l0, l1), l0), n1, n0)))"
             ,(char (*) [33])"if 0 ==> (1 ==> 0 else 1) then 1",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2eb,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  LVar1.super_ExprBase.impl_ =
       (ExprBase)
       (this->super_ExprWriterTest).l0.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
       super_ExprBase.impl_;
  BVar4 = mp::BasicExprFactory<std::allocator<char>>::
          MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,FIRST_BINARY_LOGICAL,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     (this->super_ExprWriterTest).l1.
                     super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)LVar1.super_ExprBase.impl_);
  BVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,LVar1,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     BVar4.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.super_ExprBase.
                     impl_,(BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                           (this->super_ExprWriterTest).l1.
                           super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.
                           impl_);
  EVar5.impl_ = else_expr.impl_;
  local_68.data_ =
       (AssertHelperData *)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,
                  (LogicalExpr)
                  BVar3.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_
                  ,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                   then_expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                   impl_,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)else_expr.impl_);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_50,(fmt *)0x14e4d3,(CStringRef)&local_68,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)EVar5.impl_);
  testing::internal::CmpHelperEQ<char[30],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"if 0 ==> 1 || 0 else 1 then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeImplication( l0, MakeBinaryLogical(ex::OR, l1, l0), l1), n1, n0)))"
             ,(char (*) [30])"if 0 ==> 1 || 0 else 1 then 1",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2ee,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  LVar1.super_ExprBase.impl_ =
       (ExprBase)
       (this->super_ExprWriterTest).l0.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
       super_ExprBase.impl_;
  BVar4 = mp::BasicExprFactory<std::allocator<char>>::
          MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,IFF,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     (this->super_ExprWriterTest).l1.
                     super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)LVar1.super_ExprBase.impl_);
  BVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,LVar1,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     BVar4.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.super_ExprBase.
                     impl_,(BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                           (this->super_ExprWriterTest).l1.
                           super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.
                           impl_);
  local_68.data_ =
       (AssertHelperData *)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,
                  (LogicalExpr)
                  BVar3.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_
                  ,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                   then_expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                   impl_,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)else_expr.impl_);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_50,(fmt *)0x14e4d3,(CStringRef)&local_68,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)else_expr.impl_);
  testing::internal::CmpHelperEQ<char[34],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"if 0 ==> (1 <==> 0) else 1 then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeImplication( l0, MakeBinaryLogical(ex::IFF, l1, l0), l1), n1, n0)))"
             ,(char (*) [34])"if 0 ==> (1 <==> 0) else 1 then 1",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2f1,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ExprWriterTest, ImplicationExprPrecedence) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  CHECK_WRITE("if 0 ==> 1 ==> 0 then 1",
      MakeIf(MakeImplication(MakeImplication(l0, l1, l0), l0, l0), n1, n0));
  CHECK_WRITE("if 0 ==> 1 ==> 0 else 1 then 1",
      MakeIf(MakeImplication(MakeImplication(l0, l1, l0), l0, l1), n1, n0));
  CHECK_WRITE("if 0 ==> 1 else 0 ==> 1 then 1",
      MakeIf(MakeImplication(l0, l1, MakeImplication(l0, l1, l0)), n1, n0));
  CHECK_WRITE("if 0 ==> (1 ==> 0) else 1 then 1",
      MakeIf(MakeImplication(l0, MakeImplication(l1, l0, l0), l1), n1, n0));
  CHECK_WRITE("if 0 ==> (1 ==> 0 else 1) then 1",
      MakeIf(MakeImplication(l0, MakeImplication(l1, l0, l1), l0), n1, n0));
  CHECK_WRITE("if 0 ==> 1 || 0 else 1 then 1",
              MakeIf(MakeImplication(
                       l0, MakeBinaryLogical(ex::OR, l1, l0), l1), n1, n0));
  CHECK_WRITE("if 0 ==> (1 <==> 0) else 1 then 1",
              MakeIf(MakeImplication(
                       l0, MakeBinaryLogical(ex::IFF, l1, l0), l1), n1, n0));
}